

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O3

iterator __thiscall
cppcms::impl::details::
basic_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator,cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_s...r,cppcms::impl::process_settings::process_memory>>>,cppcms::impl::process_settings::process_memory>>
::
find_in_range<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>>
          (basic_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator,cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_s___r,cppcms::impl::process_settings::process_memory>>>,cppcms::impl::process_settings::process_memory>>
           *this,range_type *r,
          basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
          *k)

{
  pointer __s2;
  size_t __n;
  iterator pcVar1;
  int iVar2;
  iterator pcVar3;
  
  pcVar3 = r->first;
  if (pcVar3 != (iterator)0x0) {
    __s2 = (k->_M_dataplus)._M_p;
    __n = k->_M_string_length;
    pcVar1 = r->second;
    do {
      if (((pcVar3->val).first._M_string_length == __n) &&
         (iVar2 = bcmp((pcVar3->val).first._M_dataplus._M_p,__s2,__n), iVar2 == 0)) {
        return pcVar3;
      }
    } while ((pcVar3 != pcVar1) && (pcVar3 = pcVar3->next, pcVar3 != (container *)0x0));
  }
  return (iterator)0x0;
}

Assistant:

iterator find_in_range(range_type &r,Kt const &k)
	{
		for(iterator p=r.first;p!=0;p=p->next) {
			Equals compare;
			if(compare(p->val.first,k)) {
				return p;
			}
			if(p==r.second)
				return 0;
		}
		return 0;
	}